

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

UA_BrowseResult *
UA_Server_browse(UA_BrowseResult *__return_storage_ptr__,UA_Server *server,UA_UInt32 maxrefs,
                UA_BrowseDescription *descr)

{
  (__return_storage_ptr__->continuationPoint).data = (UA_Byte *)0x0;
  __return_storage_ptr__->referencesSize = 0;
  *(undefined8 *)__return_storage_ptr__ = 0;
  (__return_storage_ptr__->continuationPoint).length = 0;
  __return_storage_ptr__->references = (UA_ReferenceDescription *)0x0;
  Service_Browse_single
            (server,&adminSession,(ContinuationPointEntry *)0x0,descr,maxrefs,__return_storage_ptr__
            );
  return __return_storage_ptr__;
}

Assistant:

UA_BrowseResult
UA_Server_browse(UA_Server *server, UA_UInt32 maxrefs, const UA_BrowseDescription *descr) {
    UA_BrowseResult result;
    UA_BrowseResult_init(&result);
    UA_RCU_LOCK();
    Service_Browse_single(server, &adminSession, NULL, descr, maxrefs, &result);
    UA_RCU_UNLOCK();
    return result;
}